

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O0

void __thiscall QTranslatorPrivate::clear(QTranslatorPrivate *this)

{
  bool bVar1;
  QEvent *this_00;
  QTranslatorPrivate *in_RDI;
  int unaff_retaddr;
  QEvent *in_stack_00000008;
  QObject *in_stack_00000010;
  QTranslator *q;
  nullptr_t in_stack_ffffffffffffffb8;
  QString *in_stack_ffffffffffffffc0;
  
  q_func(in_RDI);
  if ((in_RDI->unmapPointer != (char *)0x0) && (in_RDI->unmapLength != 0)) {
    if ((in_RDI->field_0x78 & 1) == 0) {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QResource,_std::default_delete<QResource>_> *)0x42e137);
      if ((!bVar1) && (in_RDI->unmapPointer != (char *)0x0)) {
        operator_delete__(in_RDI->unmapPointer);
      }
    }
    else {
      in_RDI->field_0x78 = in_RDI->field_0x78 & 0xfe;
      munmap(in_RDI->unmapPointer,in_RDI->unmapLength);
    }
  }
  std::unique_ptr<QResource,_std::default_delete<QResource>_>::operator=
            ((unique_ptr<QResource,_std::default_delete<QResource>_> *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  in_RDI->unmapPointer = (char *)0x0;
  in_RDI->unmapLength = 0;
  in_RDI->messageArray = (uchar *)0x0;
  in_RDI->contextArray = (uchar *)0x0;
  in_RDI->offsetArray = (uchar *)0x0;
  in_RDI->numerusRulesArray = (uchar *)0x0;
  in_RDI->messageLength = 0;
  in_RDI->contextLength = 0;
  in_RDI->offsetLength = 0;
  in_RDI->numerusRulesLength = 0;
  std::
  vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
  ::clear((vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
           *)0x42e1f2);
  QString::clear(in_stack_ffffffffffffffc0);
  QString::clear(in_stack_ffffffffffffffc0);
  bVar1 = QCoreApplicationPrivate::isTranslatorInstalled((QTranslator *)in_RDI);
  if (bVar1) {
    QCoreApplication::instance();
    this_00 = (QEvent *)operator_new(0x10);
    QEvent::QEvent(this_00,LanguageChange);
    QCoreApplication::postEvent(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  return;
}

Assistant:

void QTranslatorPrivate::clear()
{
    Q_Q(QTranslator);
    if (unmapPointer && unmapLength) {
#if defined(QT_USE_MMAP)
        if (used_mmap) {
            used_mmap = false;
            munmap(unmapPointer, unmapLength);
        } else
#endif
        if (!resource)
            delete [] unmapPointer;
    }

    resource = nullptr;
    unmapPointer = nullptr;
    unmapLength = 0;
    messageArray = nullptr;
    contextArray = nullptr;
    offsetArray = nullptr;
    numerusRulesArray = nullptr;
    messageLength = 0;
    contextLength = 0;
    offsetLength = 0;
    numerusRulesLength = 0;

    subTranslators.clear();

    language.clear();
    filePath.clear();

    if (QCoreApplicationPrivate::isTranslatorInstalled(q))
        QCoreApplication::postEvent(QCoreApplication::instance(),
                                    new QEvent(QEvent::LanguageChange));
}